

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

void recff_string_format(jit_State *J,RecordFFData *rd)

{
  TRef TVar1;
  TRef TVar2;
  SFormat k;
  TRef TVar3;
  IRCallID IVar4;
  uint uVar5;
  GCobj *pGVar6;
  IRCallID id;
  IRRef1 IVar7;
  IRRef1 IVar8;
  int iVar9;
  int local_60;
  FormatState fs;
  
  TVar1 = lj_ir_tostr(J,*J->base);
  pGVar6 = (GCobj *)argv2str(J,rd->argv);
  TVar2 = lj_ir_kgc(J,pGVar6,IRT_STR);
  (J->fold).ins.field_0.ot = 0x884;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
  lj_opt_fold(J);
  TVar2 = recff_bufhdr(J);
  fs.p = (uint8_t *)&(pGVar6->gch).metatable;
  fs.e = (uint8_t *)((long)pGVar6 + (ulong)(pGVar6->str).len + 0x10);
  local_60 = 1;
  iVar9 = 0x65;
  TVar1 = TVar2;
  do {
    k = lj_strfmt_parse(&fs);
    IVar8 = (IRRef1)TVar1;
    if (k == 2) {
      lj_ir_kint(J,2);
LAB_00150430:
      pGVar6 = (GCobj *)lj_str_new(J->L,fs.str,(ulong)fs.len);
      TVar1 = lj_ir_kgc(J,pGVar6,IRT_STR);
      (J->fold).ins.field_0.ot = 0x5405;
      (J->fold).ins.field_0.op1 = IVar8;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
      TVar1 = lj_opt_fold(J);
    }
    else {
      if (k == 0) {
        (J->fold).ins.field_0.ot = 0x5504;
        (J->fold).ins.field_0.op1 = IVar8;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
        TVar1 = lj_opt_fold(J);
        *J->base = TVar1;
        return;
      }
      uVar5 = J->base[local_60];
      TVar3 = lj_ir_kint(J,k);
      if (5 < (k & 0xf) - 2) {
LAB_00150600:
        recff_nyi(J,rd);
        return;
      }
      local_60 = local_60 + 1;
      IVar4 = IRCALL_lj_strfmt_putfnum_int;
      IVar7 = (IRRef1)uVar5;
      id = IRCALL_lj_strfmt_putfnum;
      switch(k & 0xf) {
      case 2:
        goto LAB_00150430;
      case 4:
        IVar4 = IRCALL_lj_strfmt_putfnum_uint;
        break;
      case 5:
        goto switchD_00150417_caseD_5;
      case 6:
        if ((uVar5 & 0x1f000000) != 0x4000000) goto LAB_00150600;
        if (k != 6) {
          if ((k & 0x10) == 0) {
            TVar1 = lj_ir_call(J,IRCALL_lj_strfmt_putfstr,(ulong)TVar1,(ulong)TVar3,(ulong)uVar5);
          }
          else {
            TVar1 = lj_ir_call(J,IRCALL_lj_strfmt_putquoted,(ulong)TVar1,(ulong)uVar5);
          }
          goto LAB_00150586;
        }
        (J->fold).ins.field_0.ot = 0x5405;
        (J->fold).ins.field_0.op1 = IVar8;
        (J->fold).ins.field_0.op2 = IVar7;
        goto LAB_0015053c;
      case 7:
        uVar5 = lj_opt_narrow_toint(J,uVar5);
        if (k == 7) {
          (J->fold).ins.field_0.op1 = (IRRef1)uVar5;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b040002;
          goto LAB_00150519;
        }
        id = IRCALL_lj_strfmt_putfchar;
        goto LAB_0015056d;
      }
      id = IVar4;
      if ((uVar5 >> 0x18 & 0x1f) - 0xf < 5) {
        if (k == 3) {
          (J->fold).ins.field_0.op1 = IVar7;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b040000;
LAB_00150519:
          TVar1 = lj_opt_fold(J);
          (J->fold).ins.field_0.ot = 0x5405;
          (J->fold).ins.field_0.op1 = IVar8;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
LAB_0015053c:
          TVar1 = lj_opt_fold(J);
          goto LAB_00150586;
        }
        (J->fold).ins.field_0.op1 = IVar7;
        *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x59160ad3;
        uVar5 = lj_opt_fold(J);
        id = IRCALL_lj_strfmt_putfxint;
      }
      else {
switchD_00150417_caseD_5:
        uVar5 = lj_ir_tonum(J,uVar5);
      }
LAB_0015056d:
      TVar1 = lj_ir_call(J,id,(ulong)TVar1,(ulong)TVar3,(ulong)uVar5);
    }
LAB_00150586:
    iVar9 = iVar9 + -1;
    if (iVar9 == 0) {
      lj_trace_err(J,LJ_TRERR_TRACEOV);
    }
  } while( true );
}

Assistant:

static void LJ_FASTCALL recff_string_format(jit_State *J, RecordFFData *rd)
{
  TRef trfmt = lj_ir_tostr(J, J->base[0]);
  GCstr *fmt = argv2str(J, &rd->argv[0]);
  int arg = 1;
  TRef hdr, tr;
  FormatState fs;
  SFormat sf;
  int nfmt = 0;
  /* Specialize to the format string. */
  emitir(IRTG(IR_EQ, IRT_STR), trfmt, lj_ir_kstr(J, fmt));
  tr = hdr = recff_bufhdr(J);
  lj_strfmt_init(&fs, strdata(fmt), fmt->len);
  while ((sf = lj_strfmt_parse(&fs)) != STRFMT_EOF) {  /* Parse format. */
    TRef tra = sf == STRFMT_LIT ? 0 : J->base[arg++];
    TRef trsf = lj_ir_kint(J, (int32_t)sf);
    IRCallID id;
    switch (STRFMT_TYPE(sf)) {
    case STRFMT_LIT:
      tr = emitir(IRT(IR_BUFPUT, IRT_PGC), tr,
		  lj_ir_kstr(J, lj_str_new(J->L, fs.str, fs.len)));
      break;
    case STRFMT_INT:
      id = IRCALL_lj_strfmt_putfnum_int;
    handle_int:
      if (!tref_isinteger(tra))
	goto handle_num;
      if (sf == STRFMT_INT) { /* Shortcut for plain %d. */
	tr = emitir(IRT(IR_BUFPUT, IRT_PGC), tr,
		    emitir(IRT(IR_TOSTR, IRT_STR), tra, IRTOSTR_INT));
      } else {
#if LJ_HASFFI
	tra = emitir(IRT(IR_CONV, IRT_U64), tra,
		     (IRT_INT|(IRT_U64<<5)|IRCONV_SEXT));
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfxint, tr, trsf, tra);
	lj_needsplit(J);
#else
	recff_nyiu(J, rd);  /* Don't bother working around this NYI. */
	return;
#endif
      }
      break;
    case STRFMT_UINT:
      id = IRCALL_lj_strfmt_putfnum_uint;
      goto handle_int;
    case STRFMT_NUM:
      id = IRCALL_lj_strfmt_putfnum;
    handle_num:
      tra = lj_ir_tonum(J, tra);
      tr = lj_ir_call(J, id, tr, trsf, tra);
      if (LJ_SOFTFP32) lj_needsplit(J);
      break;
    case STRFMT_STR:
      if (!tref_isstr(tra)) {
	recff_nyiu(J, rd);  /* NYI: __tostring and non-string types for %s. */
	return;
      }
      if (sf == STRFMT_STR)  /* Shortcut for plain %s. */
	tr = emitir(IRT(IR_BUFPUT, IRT_PGC), tr, tra);
      else if ((sf & STRFMT_T_QUOTED))
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putquoted, tr, tra);
      else
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfstr, tr, trsf, tra);
      break;
    case STRFMT_CHAR:
      tra = lj_opt_narrow_toint(J, tra);
      if (sf == STRFMT_CHAR)  /* Shortcut for plain %c. */
	tr = emitir(IRT(IR_BUFPUT, IRT_PGC), tr,
		    emitir(IRT(IR_TOSTR, IRT_STR), tra, IRTOSTR_CHAR));
      else
	tr = lj_ir_call(J, IRCALL_lj_strfmt_putfchar, tr, trsf, tra);
      break;
    case STRFMT_PTR:  /* NYI */
    case STRFMT_ERR:
    default:
      recff_nyiu(J, rd);
      return;
    }
    if (++nfmt > 100) lj_trace_err(J, LJ_TRERR_TRACEOV);
  }
  J->base[0] = emitir(IRT(IR_BUFSTR, IRT_STR), tr, hdr);
}